

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

int equal_wildcard(uchar *pattern,size_t pattern_len,uchar *subject,size_t subject_len,uint flags)

{
  int iVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  size_t sVar5;
  byte *a;
  uchar *pattern_len_00;
  int iVar6;
  uchar *puVar7;
  bool bVar8;
  
  if ((subject_len < 2) || (*subject != '.')) {
    iVar6 = 0;
    bVar2 = 1;
    pbVar4 = (byte *)0x0;
    a = pattern;
    sVar5 = pattern_len;
    while (sVar5 != 0) {
      if (*a == 0x2a) {
        bVar8 = true;
        if (sVar5 != 1) {
          bVar8 = a[1] == 0x2e;
        }
        if ((pbVar4 != (byte *)0x0) || ((bVar8 & bVar2 & ((bVar2 & 8) == 0 && iVar6 == 0)) != 1))
        goto LAB_0020850f;
        bVar2 = bVar2 & 0xf6;
        iVar6 = 0;
        pbVar4 = a;
      }
      else {
        iVar1 = OPENSSL_isalnum((uint)*a);
        if (iVar1 == 0) {
          if (*a == 0x2d) {
            if ((bVar2 & 1) != 0) goto LAB_0020850f;
            bVar2 = bVar2 | 4;
          }
          else {
            if ((*a != 0x2e) || ((bVar2 & 5) != 0)) goto LAB_0020850f;
            iVar6 = iVar6 + 1;
            bVar2 = 1;
          }
        }
        else {
          if (((3 < sVar5) && ((bVar2 & 1) != 0)) &&
             (iVar1 = OPENSSL_strncasecmp((char *)a,"xn--",4), iVar1 == 0)) {
            bVar2 = 8;
          }
          bVar2 = bVar2 & 0xfa;
        }
      }
      a = a + 1;
      sVar5 = sVar5 - 1;
    }
    if (pbVar4 != (byte *)0x0 && (1 < iVar6 && (bVar2 & 5) == 0)) {
      sVar5 = (long)pbVar4 - (long)pattern;
      pattern_len_00 = pattern + ~(ulong)pbVar4 + pattern_len;
      iVar6 = 0;
      if ((pattern_len_00 + sVar5 <= subject_len) &&
         (iVar1 = equal_nocase(pattern,sVar5,subject,sVar5,flags), iVar1 != 0)) {
        iVar1 = equal_nocase(subject + (subject_len - (long)pattern_len_00),(size_t)pattern_len_00,
                             pbVar4 + 1,(size_t)pattern_len_00,flags);
        iVar6 = 0;
        if (iVar1 != 0) {
          if ((pbVar4 == pattern) && (pbVar4[1] == 0x2e)) {
            if ((uchar *)subject_len == pattern_len_00) {
              return 0;
            }
          }
          else if ((3 < subject_len) &&
                  (iVar6 = OPENSSL_strncasecmp((char *)subject,"xn--",4), iVar6 == 0)) {
            return 0;
          }
          puVar7 = subject + sVar5;
          if ((subject + (subject_len - (long)pattern_len_00) == puVar7 + 1) && (*puVar7 == '*')) {
            iVar6 = 1;
          }
          else {
            iVar6 = 1;
            for (lVar3 = 0; (subject_len - pattern_len) + 1 != lVar3; lVar3 = lVar3 + 1) {
              iVar1 = OPENSSL_isalnum((uint)puVar7[lVar3]);
              if ((iVar1 == 0) && (puVar7[lVar3] != '-')) {
                return 0;
              }
            }
          }
        }
      }
      return iVar6;
    }
  }
LAB_0020850f:
  iVar6 = equal_nocase(pattern,pattern_len,subject,subject_len,flags);
  return iVar6;
}

Assistant:

static int equal_wildcard(const unsigned char *pattern, size_t pattern_len,
                          const unsigned char *subject, size_t subject_len,
                          unsigned int flags) {
  const unsigned char *star = NULL;

  // Subject names starting with '.' can only match a wildcard pattern
  // via a subject sub-domain pattern suffix match.
  if (!(subject_len > 1 && subject[0] == '.')) {
    star = valid_star(pattern, pattern_len, flags);
  }
  if (star == NULL) {
    return equal_nocase(pattern, pattern_len, subject, subject_len, flags);
  }
  return wildcard_match(pattern, star - pattern, star + 1,
                        (pattern + pattern_len) - star - 1, subject,
                        subject_len, flags);
}